

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O1

void duckdb::AgeFunctionStandard(DataChunk *input,ExpressionState *state,Vector *result)

{
  element_type *count;
  interval_t *piVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var4;
  timestamp_t tVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong *puVar7;
  byte bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  SelectionVector *pSVar10;
  data_ptr_t pdVar11;
  date_t date;
  ClientContext *context;
  MetaTransaction *pMVar12;
  reference vector;
  undefined1 *puVar13;
  element_type *peVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  ulong uVar16;
  idx_t idx_in_entry;
  element_type *peVar17;
  element_type *peVar18;
  unsigned_long uVar19;
  idx_t idx_in_entry_1;
  ulong uVar20;
  ValidityMask *pVVar21;
  int64_t *piVar22;
  interval_t iVar23;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  int64_t *local_c8;
  buffer_ptr<ValidityBuffer> *local_c0;
  timestamp_t local_b8;
  idx_t local_b0;
  buffer_ptr<ValidityBuffer> *local_a8;
  ValidityMask *local_a0;
  data_ptr_t local_98;
  ulong local_90;
  UnifiedVectorFormat local_88;
  ulong local_38;
  
  context = ExpressionState::GetContext(state);
  pMVar12 = MetaTransaction::Get(context);
  date = Timestamp::GetDate((timestamp_t)(pMVar12->start_timestamp).value);
  local_b8 = Timestamp::FromDatetime(date,(dtime_t)0x0);
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  count = (element_type *)input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_c8 = (int64_t *)result->data;
    pdVar3 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        local_c8 = (int64_t *)((long)local_c8 + 8);
        peVar17 = (element_type *)0x0;
        do {
          tVar5.value = *(int64_t *)(pdVar3 + (long)peVar17 * 8);
          if ((tVar5.value == -0x7fffffffffffffff) || (tVar5.value == 0x7fffffffffffffff)) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_d8 = (element_type *)
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_88,(unsigned_long *)&local_d8);
              pdVar11 = local_88.data;
              pSVar10 = local_88.sel;
              local_88.sel = (SelectionVector *)0x0;
              local_88.data = (data_ptr_t)0x0;
              p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar10;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar11;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar8 = (byte)peVar17 & 0x3f;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     ((ulong)peVar17 >> 6);
            *puVar7 = *puVar7 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            iVar23 = (interval_t)ZEXT816(0);
          }
          else {
            iVar23 = Interval::GetAge(local_b8,tVar5);
          }
          local_c8[-1] = iVar23._0_8_;
          *local_c8 = iVar23.micros;
          peVar17 = (element_type *)
                    ((long)&(peVar17->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
          local_c8 = local_c8 + 2;
        } while (count != peVar17);
      }
    }
    else {
      local_a0 = &vector->validity;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)count;
      local_d8 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long **)local_a0,(unsigned_long *)&local_d8);
      pdVar11 = local_88.data;
      pSVar10 = local_88.sel;
      local_88.sel = (SelectionVector *)0x0;
      local_88.data = (data_ptr_t)0x0;
      p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar10;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar11;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      local_a8 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data);
      }
      pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(local_a8)
      ;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar15->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      puVar13 = (undefined1 *)
                ((long)&count[7].owned_data.
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                        _M_t + 7);
      if ((undefined1 *)0x3f < puVar13) {
        local_90 = (ulong)puVar13 >> 6;
        local_c8 = (int64_t *)((long)local_c8 + 8);
        local_38 = 0;
        peVar17 = (element_type *)0x0;
        pVVar21 = local_a0;
        local_98 = pdVar3;
        do {
          pdVar3 = local_98;
          puVar2 = (pVVar21->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar19 = 0xffffffffffffffff;
          }
          else {
            uVar19 = puVar2[local_38];
          }
          peVar14 = peVar17 + 8;
          if (count <= peVar17 + 8) {
            peVar14 = count;
          }
          peVar18 = peVar14;
          if (uVar19 != 0) {
            peVar18 = peVar17;
            if (uVar19 == 0xffffffffffffffff) {
              if (peVar17 < peVar14) {
                piVar22 = (int64_t *)((long)local_c8 + (long)peVar17 * 0x10);
                do {
                  tVar5.value = *(int64_t *)(pdVar3 + (long)peVar18 * 8);
                  if ((tVar5.value == -0x7fffffffffffffff) || (tVar5.value == 0x7fffffffffffffff)) {
                    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) {
                      local_d8 = (element_type *)
                                 (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)&local_88,(unsigned_long *)&local_d8);
                      pdVar11 = local_88.data;
                      pSVar10 = local_88.sel;
                      local_88.sel = (SelectionVector *)0x0;
                      local_88.data = (data_ptr_t)0x0;
                      p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)pSVar10;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar11;
                      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data);
                      }
                      pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(local_a8);
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                           (unsigned_long *)
                           (pTVar15->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar8 = (byte)peVar18 & 0x3f;
                    puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + ((ulong)peVar18 >> 6);
                    *puVar7 = *puVar7 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                    iVar23 = (interval_t)ZEXT816(0);
                  }
                  else {
                    iVar23 = Interval::GetAge(local_b8,tVar5);
                  }
                  piVar22[-1] = iVar23._0_8_;
                  *piVar22 = iVar23.micros;
                  peVar18 = (element_type *)
                            ((long)&(peVar18->owned_data).
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    ._M_t + 1);
                  piVar22 = piVar22 + 2;
                } while (peVar14 != peVar18);
              }
            }
            else if (peVar17 < peVar14) {
              piVar22 = (int64_t *)((long)local_c8 + (long)peVar17 * 0x10);
              local_c0 = (buffer_ptr<ValidityBuffer> *)(local_98 + (long)peVar17 * 8);
              uVar20 = 0;
              do {
                if ((uVar19 >> (uVar20 & 0x3f) & 1) != 0) {
                  tVar5.value = (int64_t)(&(local_c0->internal).
                                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)[uVar20];
                  if ((tVar5.value == -0x7fffffffffffffff) || (tVar5.value == 0x7fffffffffffffff)) {
                    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                        == (unsigned_long *)0x0) {
                      local_d8 = (element_type *)
                                 (result->validity).super_TemplatedValidityMask<unsigned_long>.
                                 capacity;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)&local_88,(unsigned_long *)&local_d8);
                      pdVar3 = local_88.data;
                      pSVar10 = local_88.sel;
                      local_88.sel = (SelectionVector *)0x0;
                      local_88.data = (data_ptr_t)0x0;
                      p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data.internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)pSVar10;
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar3;
                      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data);
                      }
                      pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(local_a8);
                      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                           (unsigned_long *)
                           (pTVar15->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    uVar16 = (long)&(peVar17->owned_data).
                                    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                    ._M_t + uVar20;
                    bVar8 = (byte)uVar16 & 0x3f;
                    puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + (uVar16 >> 6);
                    *puVar7 = *puVar7 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                    iVar23 = (interval_t)ZEXT816(0);
                  }
                  else {
                    iVar23 = Interval::GetAge(local_b8,tVar5);
                  }
                  piVar22[-1] = iVar23._0_8_;
                  *piVar22 = iVar23.micros;
                }
                uVar20 = uVar20 + 1;
                piVar22 = piVar22 + 2;
              } while ((long)peVar17 + (uVar20 - (long)peVar14) != 0);
              peVar18 = (element_type *)
                        ((long)&(peVar17->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t + uVar20);
              pVVar21 = local_a0;
            }
          }
          local_38 = local_38 + 1;
          peVar17 = peVar18;
        } while (local_38 != local_90);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    piVar1 = (interval_t *)result->data;
    piVar22 = (int64_t *)vector->data;
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    tVar5.value = *piVar22;
    if ((tVar5.value == -0x7fffffffffffffff) || (tVar5.value == 0x7fffffffffffffff)) {
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        local_d8 = (element_type *)
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_88,(unsigned_long *)&local_d8);
        pdVar3 = local_88.data;
        pSVar10 = local_88.sel;
        local_88.sel = (SelectionVector *)0x0;
        local_88.data = (data_ptr_t)0x0;
        p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pSVar10;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar3;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.data);
        }
        pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                              validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)
             (pTVar15->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      *puVar7 = *puVar7 & 0xfffffffffffffffe;
      iVar23 = (interval_t)ZEXT816(0);
    }
    else {
      iVar23 = Interval::GetAge(local_b8,tVar5);
    }
    *piVar1 = iVar23;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_88);
    Vector::ToUnifiedFormat(vector,(idx_t)count,&local_88);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar3 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != (element_type *)0x0) {
        _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_88.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        local_c0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        piVar22 = (int64_t *)(pdVar3 + 8);
        peVar17 = (element_type *)0x0;
        do {
          peVar14 = peVar17;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var4._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            peVar14 = (element_type *)
                      (ulong)*(uint *)((long)_Var4._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl + (long)peVar17 * 4);
          }
          tVar5.value = (int64_t)((_func_int ***)local_88.data)[(long)peVar14];
          if ((tVar5.value == -0x7fffffffffffffff) || (tVar5.value == 0x7fffffffffffffff)) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_b0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_d8,&local_b0);
              p_Var9 = p_Stack_d0;
              peVar14 = local_d8;
              local_d8 = (element_type *)0x0;
              p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_c0);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar8 = (byte)peVar17 & 0x3f;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     ((ulong)peVar17 >> 6);
            *puVar7 = *puVar7 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            iVar23 = (interval_t)ZEXT816(0);
          }
          else {
            iVar23 = Interval::GetAge(local_b8,tVar5);
          }
          piVar22[-1] = iVar23._0_8_;
          *piVar22 = iVar23.micros;
          peVar17 = (element_type *)
                    ((long)&(peVar17->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t + 1);
          piVar22 = piVar22 + 2;
        } while (count != peVar17);
      }
    }
    else if (count != (element_type *)0x0) {
      _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&(local_88.sel)->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      local_c0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      piVar22 = (int64_t *)(pdVar3 + 8);
      peVar17 = (element_type *)0x0;
      do {
        peVar14 = peVar17;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var4._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          peVar14 = (element_type *)
                    (ulong)*(uint *)((long)_Var4._M_t.
                                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                           .super__Head_base<0UL,_unsigned_long_*,_false>.
                                           _M_head_impl + (long)peVar17 * 4);
        }
        if ((local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)peVar14 >> 6] >> ((ulong)peVar14 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_b0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_d8,&local_b0);
            p_Var9 = p_Stack_d0;
            peVar14 = local_d8;
            local_d8 = (element_type *)0x0;
            p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar14;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var9;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
            }
            pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_c0);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar15->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar8 = (byte)peVar17 & 0x3f;
          puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   ((ulong)peVar17 >> 6);
          *puVar7 = *puVar7 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          tVar5.value = (int64_t)((_func_int ***)local_88.data)[(long)peVar14];
          if ((tVar5.value == -0x7fffffffffffffff) || (tVar5.value == 0x7fffffffffffffff)) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_b0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_d8,&local_b0);
              p_Var9 = p_Stack_d0;
              peVar14 = local_d8;
              local_d8 = (element_type *)0x0;
              p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar14;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var9;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
              }
              if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_c0);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar8 = (byte)peVar17 & 0x3f;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     ((ulong)peVar17 >> 6);
            *puVar7 = *puVar7 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
            iVar23 = (interval_t)ZEXT816(0);
          }
          else {
            iVar23 = Interval::GetAge(local_b8,tVar5);
          }
          piVar22[-1] = iVar23._0_8_;
          *piVar22 = iVar23.micros;
        }
        peVar17 = (element_type *)
                  ((long)&(peVar17->owned_data).
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                          _M_t + 1);
        piVar22 = piVar22 + 2;
      } while (count != peVar17);
    }
    if (local_88.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void AgeFunctionStandard(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 1);
	//	Subtract argument from current_date (at midnight)
	//	Theoretically, this should be TZ-sensitive, but since we have to be able to handle
	//	plain TZ when ICU is not loaded, we implement this in UTC (like everything else)
	//	To get the PG behaviour, we overload these functions in ICU for TSTZ arguments.
	auto current_date = Timestamp::FromDatetime(
	    Timestamp::GetDate(MetaTransaction::Get(state.GetContext()).start_timestamp), dtime_t(0));

	UnaryExecutor::ExecuteWithNulls<timestamp_t, interval_t>(input.data[0], result, input.size(),
	                                                         [&](timestamp_t input, ValidityMask &mask, idx_t idx) {
		                                                         if (Timestamp::IsFinite(input)) {
			                                                         return Interval::GetAge(current_date, input);
		                                                         } else {
			                                                         mask.SetInvalid(idx);
			                                                         return interval_t();
		                                                         }
	                                                         });
}